

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppAutoResize(bool *p_open)

{
  bool bVar1;
  char *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int *in_stack_00000008;
  int i;
  ImGuiWindowFlags in_stack_000003a4;
  bool *in_stack_000003a8;
  char *in_stack_000003b0;
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  ImGuiSliderFlags in_stack_fffffffffffffff4;
  uint uVar2;
  
  bVar1 = ImGui::Begin(in_stack_000003b0,in_stack_000003a8,in_stack_000003a4);
  if (bVar1) {
    ImGui::TextUnformatted
              ((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffe8);
    ImGui::SliderInt(p_open,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,in_RDI,
                     in_stack_fffffffffffffff4);
    for (uVar2 = 0; (int)uVar2 < ShowExampleAppAutoResize::lines; uVar2 = uVar2 + 1) {
      ImGui::Text("%*sThis is line %d",(ulong)(uVar2 << 2),"",(ulong)uVar2);
    }
    ImGui::End();
  }
  else {
    ImGui::End();
  }
  return;
}

Assistant:

static void ShowExampleAppAutoResize(bool* p_open)
{
    if (!ImGui::Begin("Example: Auto-resizing window", p_open, ImGuiWindowFlags_AlwaysAutoResize))
    {
        ImGui::End();
        return;
    }

    static int lines = 10;
    ImGui::TextUnformatted(
        "Window will resize every-frame to the size of its content.\n"
        "Note that you probably don't want to query the window size to\n"
        "output your content because that would create a feedback loop.");
    ImGui::SliderInt("Number of lines", &lines, 1, 20);
    for (int i = 0; i < lines; i++)
        ImGui::Text("%*sThis is line %d", i * 4, "", i); // Pad with space to extend size horizontally
    ImGui::End();
}